

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

int KINPicardFcnEval(KINMem kin_mem,N_Vector gval,N_Vector uval,N_Vector fval1)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int retval;
  
  if (*(long *)(in_RDI + 0x40) <= *(long *)(in_RDI + 0xd0) - *(long *)(in_RDI + 0xe0)) {
    *(undefined8 *)(in_RDI + 200) = 0x4000000000000000;
    *(undefined4 *)(in_RDI + 0x74) = 1;
  }
  while( true ) {
    *(undefined4 *)(in_RDI + 100) = 0;
    if ((1.5 < *(double *)(in_RDI + 200)) && (*(long *)(in_RDI + 0x238) != 0)) {
      iVar1 = (**(code **)(in_RDI + 0x238))(in_RDI);
      *(undefined4 *)(in_RDI + 100) = 1;
      *(undefined8 *)(in_RDI + 0xe0) = *(undefined8 *)(in_RDI + 0xd0);
      *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)(in_RDI + 0xd0);
      if (iVar1 != 0) {
        return -0xb;
      }
    }
    N_VScale(&DAT_bff0000000000000,in_RCX,in_RCX);
    iVar1 = (**(code **)(in_RDI + 0x240))(in_RDI,in_RSI,in_RCX,in_RDI + 0x278,in_RDI + 0x270);
    if (iVar1 == 0) {
      N_VLinearSum(0x3ff0000000000000,in_RDX,in_RSI,in_RSI);
      return 0;
    }
    if (iVar1 < 0) {
      return -0xc;
    }
    if ((*(long *)(in_RDI + 0x238) == 0) || (*(int *)(in_RDI + 100) != 0)) break;
    *(undefined8 *)(in_RDI + 200) = 0x4000000000000000;
  }
  return -9;
}

Assistant:

static int KINPicardFcnEval(KINMem kin_mem, N_Vector gval, N_Vector uval,
                            N_Vector fval1)
{
  int retval;

  if ((kin_mem->kin_nni - kin_mem->kin_nnilset) >= kin_mem->kin_msbset)
  {
    kin_mem->kin_sthrsh           = TWO;
    kin_mem->kin_update_fnorm_sub = SUNTRUE;
  }

  for (;;)
  {
    kin_mem->kin_jacCurrent = SUNFALSE;

    if ((kin_mem->kin_sthrsh > ONEPT5) && (kin_mem->kin_lsetup != NULL))
    {
      retval                   = kin_mem->kin_lsetup(kin_mem);
      kin_mem->kin_jacCurrent  = SUNTRUE;
      kin_mem->kin_nnilset     = kin_mem->kin_nni;
      kin_mem->kin_nnilset_sub = kin_mem->kin_nni;
      if (retval != 0) { return (KIN_LSETUP_FAIL); }
    }

    /* call the generic 'lsolve' routine to solve the system Lx = -fval
       Note that we are using gval to hold x. */
    N_VScale(-ONE, fval1, fval1);
    retval = kin_mem->kin_lsolve(kin_mem, gval, fval1, &(kin_mem->kin_sJpnorm),
                                 &(kin_mem->kin_sFdotJp));

    if (retval == 0)
    {
      /* Update gval = uval + gval since gval = -L^{-1}F(uu)  */
      N_VLinearSum(ONE, uval, ONE, gval, gval);
      return (KIN_SUCCESS);
    }
    else if (retval < 0) { return (KIN_LSOLVE_FAIL); }
    else if ((kin_mem->kin_lsetup == NULL) || (kin_mem->kin_jacCurrent))
    {
      return (KIN_LINSOLV_NO_RECOVERY);
    }

    /* loop back only if the linear solver setup is in use
       and matrix information is not current */

    kin_mem->kin_sthrsh = TWO;
  }
}